

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void fdct8_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  uint uVar22;
  undefined7 in_register_00000011;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  
  iVar24 = 1 << (bit - 1U & 0x1f);
  if (0 < col_num) {
    uVar22 = (uint)CONCAT71(in_register_00000011,bit);
    lVar21 = (long)(int)uVar22 * 0x100;
    iVar23 = *(int *)((long)vert_filter_length_chroma + lVar21 + 0x1e0);
    auVar25._4_4_ = iVar23;
    auVar25._0_4_ = iVar23;
    auVar25._8_4_ = iVar23;
    auVar25._12_4_ = iVar23;
    auVar25._16_4_ = iVar23;
    auVar25._20_4_ = iVar23;
    auVar25._24_4_ = iVar23;
    auVar25._28_4_ = iVar23;
    iVar23 = -iVar23;
    uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar21 + 0x220);
    uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar21 + 0x1a0);
    uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar21 + 0x240);
    uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar21 + 0x180);
    uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar21 + 0x1c0);
    uVar6 = *(undefined4 *)((long)vert_filter_length_chroma + lVar21 + 0x200);
    auVar26._4_4_ = uVar6;
    auVar26._0_4_ = uVar6;
    auVar26._8_4_ = uVar6;
    auVar26._12_4_ = uVar6;
    auVar26._16_4_ = uVar6;
    auVar26._20_4_ = uVar6;
    auVar26._24_4_ = uVar6;
    auVar26._28_4_ = uVar6;
    auVar27._4_4_ = iVar24;
    auVar27._0_4_ = iVar24;
    auVar27._8_4_ = iVar24;
    auVar27._12_4_ = iVar24;
    auVar27._16_4_ = iVar24;
    auVar27._20_4_ = iVar24;
    auVar27._24_4_ = iVar24;
    auVar27._28_4_ = iVar24;
    lVar21 = 0;
    do {
      auVar7 = *(undefined1 (*) [32])((long)*in + lVar21);
      auVar8 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 7)] + lVar21);
      auVar9 = vpaddd_avx2(auVar8,auVar7);
      auVar13 = vpsubd_avx2(auVar7,auVar8);
      auVar7 = *(undefined1 (*) [32])((long)in[(uint)col_num] + lVar21);
      auVar8 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 6)] + lVar21);
      auVar10 = vpaddd_avx2(auVar8,auVar7);
      auVar14 = vpsubd_avx2(auVar7,auVar8);
      auVar7 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 2)] + lVar21);
      auVar8 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 5)] + lVar21);
      auVar11 = vpaddd_avx2(auVar8,auVar7);
      auVar15 = vpsubd_avx2(auVar7,auVar8);
      auVar7 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 3)] + lVar21);
      auVar8 = *(undefined1 (*) [32])((long)in[(uint)(col_num << 2)] + lVar21);
      auVar12 = vpaddd_avx2(auVar7,auVar8);
      auVar16 = vpsubd_avx2(auVar7,auVar8);
      auVar7 = vpaddd_avx2(auVar9,auVar12);
      auVar17 = vpsubd_avx2(auVar9,auVar12);
      auVar8 = vpaddd_avx2(auVar10,auVar11);
      auVar11 = vpsubd_avx2(auVar10,auVar11);
      auVar20._4_4_ = iVar23;
      auVar20._0_4_ = iVar23;
      auVar20._8_4_ = iVar23;
      auVar20._12_4_ = iVar23;
      auVar20._16_4_ = iVar23;
      auVar20._20_4_ = iVar23;
      auVar20._24_4_ = iVar23;
      auVar20._28_4_ = iVar23;
      auVar10 = vpmulld_avx2(auVar15,auVar20);
      auVar9 = vpmulld_avx2(auVar14,auVar25);
      auVar9 = vpaddd_avx2(auVar27,auVar9);
      auVar9 = vpaddd_avx2(auVar10,auVar9);
      auVar12 = vpsrad_avx2(auVar9,ZEXT416(uVar22));
      auVar9 = vpmulld_avx2(auVar15,auVar25);
      auVar10 = vpmulld_avx2(auVar20,auVar14);
      auVar10 = vpsubd_avx2(auVar27,auVar10);
      auVar9 = vpaddd_avx2(auVar10,auVar9);
      auVar14 = vpsrad_avx2(auVar9,ZEXT416(uVar22));
      auVar9 = vpmulld_avx2(auVar7,auVar25);
      auVar8 = vpmulld_avx2(auVar8,auVar25);
      auVar7 = vpaddd_avx2(auVar8,auVar27);
      auVar7 = vpaddd_avx2(auVar7,auVar9);
      auVar8 = vpsubd_avx2(auVar27,auVar8);
      auVar8 = vpaddd_avx2(auVar8,auVar9);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar19._16_4_ = uVar1;
      auVar19._20_4_ = uVar1;
      auVar19._24_4_ = uVar1;
      auVar19._28_4_ = uVar1;
      auVar9 = vpmulld_avx2(auVar11,auVar19);
      auVar15._4_4_ = uVar2;
      auVar15._0_4_ = uVar2;
      auVar15._8_4_ = uVar2;
      auVar15._12_4_ = uVar2;
      auVar15._16_4_ = uVar2;
      auVar15._20_4_ = uVar2;
      auVar15._24_4_ = uVar2;
      auVar15._28_4_ = uVar2;
      auVar10 = vpmulld_avx2(auVar17,auVar15);
      auVar9 = vpaddd_avx2(auVar27,auVar9);
      auVar9 = vpaddd_avx2(auVar10,auVar9);
      auVar10 = vpmulld_avx2(auVar17,auVar19);
      auVar11 = vpmulld_avx2(auVar15,auVar11);
      auVar11 = vpsubd_avx2(auVar27,auVar11);
      auVar10 = vpaddd_avx2(auVar11,auVar10);
      auVar11 = vpaddd_avx2(auVar16,auVar12);
      auVar15 = vpsubd_avx2(auVar16,auVar12);
      auVar16 = vpsubd_avx2(auVar13,auVar14);
      auVar12 = vpaddd_avx2(auVar13,auVar14);
      auVar18._4_4_ = uVar3;
      auVar18._0_4_ = uVar3;
      auVar18._8_4_ = uVar3;
      auVar18._12_4_ = uVar3;
      auVar18._16_4_ = uVar3;
      auVar18._20_4_ = uVar3;
      auVar18._24_4_ = uVar3;
      auVar18._28_4_ = uVar3;
      auVar14 = vpmulld_avx2(auVar11,auVar18);
      auVar17._4_4_ = uVar4;
      auVar17._0_4_ = uVar4;
      auVar17._8_4_ = uVar4;
      auVar17._12_4_ = uVar4;
      auVar17._16_4_ = uVar4;
      auVar17._20_4_ = uVar4;
      auVar17._24_4_ = uVar4;
      auVar17._28_4_ = uVar4;
      auVar13 = vpmulld_avx2(auVar12,auVar17);
      auVar14 = vpaddd_avx2(auVar27,auVar14);
      auVar14 = vpaddd_avx2(auVar13,auVar14);
      auVar28 = ZEXT416(uVar22);
      auVar14 = vpsrad_avx2(auVar14,auVar28);
      *(undefined1 (*) [32])((long)out[outstride] + lVar21) = auVar14;
      auVar12 = vpmulld_avx2(auVar12,auVar18);
      auVar11 = vpmulld_avx2(auVar17,auVar11);
      auVar11 = vpsubd_avx2(auVar27,auVar11);
      auVar11 = vpaddd_avx2(auVar11,auVar12);
      auVar11 = vpsrad_avx2(auVar11,auVar28);
      *(undefined1 (*) [32])((long)out[outstride * 7] + lVar21) = auVar11;
      auVar14._4_4_ = uVar5;
      auVar14._0_4_ = uVar5;
      auVar14._8_4_ = uVar5;
      auVar14._12_4_ = uVar5;
      auVar14._16_4_ = uVar5;
      auVar14._20_4_ = uVar5;
      auVar14._24_4_ = uVar5;
      auVar14._28_4_ = uVar5;
      auVar11 = vpmulld_avx2(auVar15,auVar14);
      auVar12 = vpmulld_avx2(auVar16,auVar26);
      auVar11 = vpaddd_avx2(auVar27,auVar11);
      auVar11 = vpaddd_avx2(auVar11,auVar12);
      auVar12 = vpmulld_avx2(auVar16,auVar14);
      auVar14 = vpmulld_avx2(auVar26,auVar15);
      auVar14 = vpsubd_avx2(auVar27,auVar14);
      auVar12 = vpaddd_avx2(auVar14,auVar12);
      auVar11 = vpsrad_avx2(auVar11,auVar28);
      auVar12 = vpsrad_avx2(auVar12,auVar28);
      *(undefined1 (*) [32])((long)out[outstride * 5] + lVar21) = auVar11;
      *(undefined1 (*) [32])((long)out[outstride * 3] + lVar21) = auVar12;
      auVar28 = ZEXT416(uVar22);
      auVar7 = vpsrad_avx2(auVar7,auVar28);
      *(undefined1 (*) [32])((long)*out + lVar21) = auVar7;
      auVar7 = vpsrad_avx2(auVar8,auVar28);
      *(undefined1 (*) [32])((long)out[outstride * 4] + lVar21) = auVar7;
      auVar7 = vpsrad_avx2(auVar9,auVar28);
      auVar8 = vpsrad_avx2(auVar10,auVar28);
      *(undefined1 (*) [32])((long)out[outstride * 2] + lVar21) = auVar7;
      *(undefined1 (*) [32])((long)out[outstride * 6] + lVar21) = auVar8;
      lVar21 = lVar21 + 0x20;
    } while ((ulong)(uint)col_num * 0x20 != lVar21);
  }
  return;
}

Assistant:

static void fdct8_avx2(__m256i *in, __m256i *out, const int8_t bit,
                       const int col_num, const int outstride) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  __m256i u[8], v[8];
  for (int col = 0; col < col_num; ++col) {
    u[0] = _mm256_add_epi32(in[0 * col_num + col], in[7 * col_num + col]);
    v[7] = _mm256_sub_epi32(in[0 * col_num + col], in[7 * col_num + col]);
    u[1] = _mm256_add_epi32(in[1 * col_num + col], in[6 * col_num + col]);
    u[6] = _mm256_sub_epi32(in[1 * col_num + col], in[6 * col_num + col]);
    u[2] = _mm256_add_epi32(in[2 * col_num + col], in[5 * col_num + col]);
    u[5] = _mm256_sub_epi32(in[2 * col_num + col], in[5 * col_num + col]);
    u[3] = _mm256_add_epi32(in[3 * col_num + col], in[4 * col_num + col]);
    v[4] = _mm256_sub_epi32(in[3 * col_num + col], in[4 * col_num + col]);
    v[0] = _mm256_add_epi32(u[0], u[3]);
    v[3] = _mm256_sub_epi32(u[0], u[3]);
    v[1] = _mm256_add_epi32(u[1], u[2]);
    v[2] = _mm256_sub_epi32(u[1], u[2]);

    v[5] = _mm256_mullo_epi32(u[5], cospim32);
    v[6] = _mm256_mullo_epi32(u[6], cospi32);
    v[5] = _mm256_add_epi32(v[5], v[6]);
    v[5] = _mm256_add_epi32(v[5], rnding);
    v[5] = _mm256_srai_epi32(v[5], bit);

    u[0] = _mm256_mullo_epi32(u[5], cospi32);
    v[6] = _mm256_mullo_epi32(u[6], cospim32);
    v[6] = _mm256_sub_epi32(u[0], v[6]);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    // stage 3
    // type 0
    v[0] = _mm256_mullo_epi32(v[0], cospi32);
    v[1] = _mm256_mullo_epi32(v[1], cospi32);
    u[0] = _mm256_add_epi32(v[0], v[1]);
    u[0] = _mm256_add_epi32(u[0], rnding);
    u[0] = _mm256_srai_epi32(u[0], bit);

    u[1] = _mm256_sub_epi32(v[0], v[1]);
    u[1] = _mm256_add_epi32(u[1], rnding);
    u[1] = _mm256_srai_epi32(u[1], bit);

    // type 1
    v[0] = _mm256_mullo_epi32(v[2], cospi48);
    v[1] = _mm256_mullo_epi32(v[3], cospi16);
    u[2] = _mm256_add_epi32(v[0], v[1]);
    u[2] = _mm256_add_epi32(u[2], rnding);
    u[2] = _mm256_srai_epi32(u[2], bit);

    v[0] = _mm256_mullo_epi32(v[2], cospi16);
    v[1] = _mm256_mullo_epi32(v[3], cospi48);
    u[3] = _mm256_sub_epi32(v[1], v[0]);
    u[3] = _mm256_add_epi32(u[3], rnding);
    u[3] = _mm256_srai_epi32(u[3], bit);

    u[4] = _mm256_add_epi32(v[4], v[5]);
    u[5] = _mm256_sub_epi32(v[4], v[5]);
    u[6] = _mm256_sub_epi32(v[7], v[6]);
    u[7] = _mm256_add_epi32(v[7], v[6]);

    // stage 4
    // stage 5
    v[0] = _mm256_mullo_epi32(u[4], cospi56);
    v[1] = _mm256_mullo_epi32(u[7], cospi8);
    v[0] = _mm256_add_epi32(v[0], v[1]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[1 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[4]

    v[0] = _mm256_mullo_epi32(u[4], cospi8);
    v[1] = _mm256_mullo_epi32(u[7], cospi56);
    v[0] = _mm256_sub_epi32(v[1], v[0]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[7 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[7]

    v[0] = _mm256_mullo_epi32(u[5], cospi24);
    v[1] = _mm256_mullo_epi32(u[6], cospi40);
    v[0] = _mm256_add_epi32(v[0], v[1]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[5 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[5]

    v[0] = _mm256_mullo_epi32(u[5], cospi40);
    v[1] = _mm256_mullo_epi32(u[6], cospi24);
    v[0] = _mm256_sub_epi32(v[1], v[0]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    out[3 * outstride + col] = _mm256_srai_epi32(v[0], bit);  // buf0[6]

    out[0 * outstride + col] = u[0];  // buf0[0]
    out[4 * outstride + col] = u[1];  // buf0[1]
    out[2 * outstride + col] = u[2];  // buf0[2]
    out[6 * outstride + col] = u[3];  // buf0[3]
  }
}